

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_penalties_accept(llama_sampler *smpl,llama_token token)

{
  mapped_type *pmVar1;
  size_t sVar2;
  int *piVar3;
  undefined4 in_ESI;
  int *in_RDI;
  ring_buffer<int> *unaff_retaddr;
  int old;
  llama_sampler_penalties *ctx;
  key_type *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  piVar3 = *(int **)(in_RDI + 2);
  if (*piVar3 != 0) {
    pmVar1 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
    *pmVar1 = *pmVar1 + 1;
    sVar2 = ring_buffer<int>::size((ring_buffer<int> *)(piVar3 + 4));
    if ((ulong)(long)*piVar3 <= sVar2) {
      piVar3 = ring_buffer<int>::front
                         ((ring_buffer<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      iVar4 = *piVar3;
      pmVar1 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      *pmVar1 = *pmVar1 + -1;
      pmVar1 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      if (*pmVar1 == 0) {
        std::
        unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::erase((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      }
    }
    ring_buffer<int>::push_back(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

static void llama_sampler_penalties_accept(struct llama_sampler * smpl, llama_token token) {
    auto * ctx = (llama_sampler_penalties *) smpl->ctx;
    if (ctx->penalty_last_n == 0) {
        return;
    }

    ctx->token_count[token]++;

    // if the ring buffer is full, remove the oldest token
    if (ctx->prev.size() >= (size_t) ctx->penalty_last_n) {
        const auto old = ctx->prev.front();

        ctx->token_count[old]--;
        if (ctx->token_count[old] == 0) {
            ctx->token_count.erase(old);
        }
    }

    ctx->prev.push_back(token);

#if 0
    // sanity check
    std::unordered_map<llama_token, int> tmp;
    for (int i = 0; i < std::min<int>(ctx->penalty_last_n, ctx->prev.size()); ++i) {
        tmp[ctx->prev.rat(i)]++;
    }

    assert(ctx->token_count == tmp);
#endif
}